

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O0

int match_class(int c,int cl)

{
  uint local_14;
  int t;
  int cl_local;
  int c_local;
  
  if ((cl & 0xc0U) == 0x40) {
    if (""[(int)(cl & 0x1f)] != 0) {
      local_14 = (uint)(""[(long)c + 1] & ""[(int)(cl & 0x1f)]);
      if ((cl & 0x20U) == 0) {
        local_14 = (uint)((local_14 != 0 ^ 0xffU) & 1);
      }
      return local_14;
    }
    if (cl == 0x7a) {
      return (uint)(c == 0);
    }
    if (cl == 0x5a) {
      return (uint)(c != 0);
    }
  }
  return (uint)(cl == c);
}

Assistant:

static int match_class(int c, int cl)
{
  if ((cl & 0xc0) == 0x40) {
    int t = match_class_map[(cl&0x1f)];
    if (t) {
      t = lj_char_isa(c, t);
      return (cl & 0x20) ? t : !t;
    }
    if (cl == 'z') return c == 0;
    if (cl == 'Z') return c != 0;
  }
  return (cl == c);
}